

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptIdentifier(HlslGrammar *this,HlslToken *idToken)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  EHlslTokenClass EVar6;
  TString *pTVar7;
  char *s;
  HlslGrammar *this_00;
  
  bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIdentifier);
  if (bVar5) {
    idToken->field_2 = (this->super_HlslTokenStream).token.field_2;
    pTVar7 = (this->super_HlslTokenStream).token.loc.name;
    iVar3 = (this->super_HlslTokenStream).token.loc.string;
    iVar4 = (this->super_HlslTokenStream).token.loc.line;
    uVar1 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    EVar6 = (this->super_HlslTokenStream).token.tokenClass;
    uVar2 = *(undefined4 *)&(this->super_HlslTokenStream).token.field_0x1c;
    (idToken->loc).column = (this->super_HlslTokenStream).token.loc.column;
    *(undefined4 *)&(idToken->loc).field_0x14 = uVar1;
    idToken->tokenClass = EVar6;
    *(undefined4 *)&idToken->field_0x1c = uVar2;
    (idToken->loc).name = pTVar7;
    (idToken->loc).string = iVar3;
    (idToken->loc).line = iVar4;
  }
  else {
    bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokThis);
    if (bVar5) {
      idToken->field_2 = (this->super_HlslTokenStream).token.field_2;
      pTVar7 = (this->super_HlslTokenStream).token.loc.name;
      iVar3 = (this->super_HlslTokenStream).token.loc.string;
      iVar4 = (this->super_HlslTokenStream).token.loc.line;
      uVar1 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      EVar6 = (this->super_HlslTokenStream).token.tokenClass;
      uVar2 = *(undefined4 *)&(this->super_HlslTokenStream).token.field_0x1c;
      (idToken->loc).column = (this->super_HlslTokenStream).token.loc.column;
      *(undefined4 *)&(idToken->loc).field_0x14 = uVar1;
      idToken->tokenClass = EVar6;
      *(undefined4 *)&idToken->field_0x1c = uVar2;
      (idToken->loc).name = pTVar7;
      (idToken->loc).string = iVar3;
      (idToken->loc).line = iVar4;
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
      idToken->tokenClass = EHTokIdentifier;
      pTVar7 = NewPoolTString_abi_cxx11_(this->intermediate->implicitThisName);
      (idToken->field_2).string = pTVar7;
      return true;
    }
    this_00 = this;
    EVar6 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    s = getTypeString(this_00,EVar6);
    if (s == (char *)0x0) {
      return false;
    }
    pTVar7 = NewPoolTString_abi_cxx11_(s);
    (this->super_HlslTokenStream).token.field_2.string = pTVar7;
    (this->super_HlslTokenStream).token.tokenClass = EHTokIdentifier;
    (idToken->field_2).string = pTVar7;
    iVar3 = (this->super_HlslTokenStream).token.loc.string;
    iVar4 = (this->super_HlslTokenStream).token.loc.line;
    (idToken->loc).name = (this->super_HlslTokenStream).token.loc.name;
    (idToken->loc).string = iVar3;
    (idToken->loc).line = iVar4;
    uVar1 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    EVar6 = (this->super_HlslTokenStream).token.tokenClass;
    uVar2 = *(undefined4 *)&(this->super_HlslTokenStream).token.field_0x1c;
    (idToken->loc).column = (this->super_HlslTokenStream).token.loc.column;
    *(undefined4 *)&(idToken->loc).field_0x14 = uVar1;
    idToken->tokenClass = EVar6;
    *(undefined4 *)&idToken->field_0x1c = uVar2;
    this->typeIdentifiers = true;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  return true;
}

Assistant:

bool HlslGrammar::acceptIdentifier(HlslToken& idToken)
{
    // IDENTIFIER
    if (peekTokenClass(EHTokIdentifier)) {
        idToken = token;
        advanceToken();
        return true;
    }

    // THIS
    // -> maps to the IDENTIFIER spelled with the internal special name for 'this'
    if (peekTokenClass(EHTokThis)) {
        idToken = token;
        advanceToken();
        idToken.tokenClass = EHTokIdentifier;
        idToken.string = NewPoolTString(intermediate.implicitThisName);
        return true;
    }

    // type that can be used as IDENTIFIER

    // Even though "sample", "bool", "float", etc keywords (for types, interpolation modifiers),
    // they ARE still accepted as identifiers.  This is not a dense space: e.g, "void" is not a
    // valid identifier, nor is "linear".  This code special cases the known instances of this, so
    // e.g, "int sample;" or "float float;" is accepted.  Other cases can be added here if needed.

    const char* idString = getTypeString(peek());
    if (idString == nullptr)
        return false;

    token.string     = NewPoolTString(idString);
    token.tokenClass = EHTokIdentifier;
    idToken = token;
    typeIdentifiers = true;

    advanceToken();

    return true;
}